

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::FixupOutPolyline(Clipper *this,OutRec *outrec)

{
  OutPt *pOVar1;
  OutPt *pOVar2;
  OutPt *pOVar3;
  OutPt *local_28;
  
  pOVar3 = outrec->Pts->Prev;
  local_28 = outrec->Pts;
  while (local_28 != pOVar3) {
    local_28 = local_28->Next;
    pOVar1 = local_28->Prev;
    if (((local_28->Pt).X == (pOVar1->Pt).X) && ((local_28->Pt).Y == (pOVar1->Pt).Y)) {
      if (local_28 == pOVar3) {
        pOVar3 = pOVar1;
      }
      pOVar2 = local_28->Next;
      pOVar1->Next = pOVar2;
      pOVar2->Prev = pOVar1;
      operator_delete(local_28,0x28);
      local_28 = pOVar1;
    }
  }
  if (local_28 == local_28->Prev) {
    DisposeOutPts(&local_28);
    outrec->Pts = (OutPt *)0x0;
  }
  return;
}

Assistant:

void Clipper::FixupOutPolyline(OutRec &outrec)
{
  OutPt *pp = outrec.Pts;
  OutPt *lastPP = pp->Prev;
  while (pp != lastPP)
  {
    pp = pp->Next;
    if (pp->Pt == pp->Prev->Pt)
    {
      if (pp == lastPP) lastPP = pp->Prev;
      OutPt *tmpPP = pp->Prev;
      tmpPP->Next = pp->Next;
      pp->Next->Prev = tmpPP;
      delete pp;
      pp = tmpPP;
    }
  }

  if (pp == pp->Prev)
  {
    DisposeOutPts(pp);
    outrec.Pts = 0;
    return;
  }
}